

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_verifier.h
# Opt level: O3

int MyGame_Example_TestSimpleTableWithEnum_verify_table(flatcc_table_verifier_descriptor_t *td)

{
  int iVar1;
  
  iVar1 = flatcc_verify_field(td,0,1,1);
  if (iVar1 == 0) {
    iVar1 = flatcc_verify_field(td,1,1,1);
    if (iVar1 == 0) {
      iVar1 = flatcc_verify_field(td,2,1,1);
      if (iVar1 == 0) {
        iVar1 = flatcc_verify_field(td,3,1,1);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int MyGame_Example_TestSimpleTableWithEnum_verify_table(flatcc_table_verifier_descriptor_t *td)
{
    int ret;
    if ((ret = flatcc_verify_field(td, 0, 1, 1) /* color */)) return ret;
    if ((ret = flatcc_verify_field(td, 1, 1, 1) /* color2 */)) return ret;
    if ((ret = flatcc_verify_field(td, 2, 1, 1) /* uc */)) return ret;
    if ((ret = flatcc_verify_field(td, 3, 1, 1) /* uc2 */)) return ret;
    return flatcc_verify_ok;
}